

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O2

QStringList * __thiscall
QAbstractFileEngine::entryList
          (QStringList *__return_storage_ptr__,QAbstractFileEngine *this,Filters filters,
          QStringList *filterNames)

{
  long in_FS_OFFSET;
  DirEntry local_50;
  QArrayDataPointer<char16_t> local_48;
  QDirListing local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  (*this->_vptr_QAbstractFileEngine[0x19])(&local_48,this,0);
  QDirListing::QDirListing
            (&local_30,(QString *)&local_48,filterNames,
             (uint)filters.super_QFlagsStorageHelper<QDir::Filter,_4>.
                   super_QFlagsStorage<QDir::Filter>.i,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  local_50.dirListPtr = (QDirListingPrivate *)QDirListing::begin(&local_30);
  for (; local_50.dirListPtr != (QDirListingPrivate *)0x0; local_50 = QDirListing::next(local_50)) {
    QDirListing::DirEntry::fileName((QString *)&local_48,&local_50);
    QList<QString>::emplaceBack<QString>(__return_storage_ptr__,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  QDirListing::~QDirListing(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QAbstractFileEngine::entryList(QDir::Filters filters, const QStringList &filterNames) const
{
    QStringList ret;
#ifdef QT_BOOTSTRAPPED
    Q_UNUSED(filters);
    Q_UNUSED(filterNames);
    Q_UNREACHABLE_RETURN(ret);
#else
    for (const auto &dirEntry : QDirListing(fileName(), filterNames, filters.toInt()))
        ret.emplace_back(dirEntry.fileName());
    return ret;
#endif
}